

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void modsqrt_free(ModsqrtContext *sc)

{
  monty_free(sc->mc);
  mp_free(sc->p);
  mp_free(sc->z);
  mp_free(sc->k);
  mp_free(sc->km1o2);
  if (sc->zk != (mp_int *)0x0) {
    mp_free(sc->zk);
  }
  safefree(sc);
  return;
}

Assistant:

void modsqrt_free(ModsqrtContext *sc)
{
    monty_free(sc->mc);
    mp_free(sc->p);
    mp_free(sc->z);
    mp_free(sc->k);
    mp_free(sc->km1o2);

    if (sc->zk)
        mp_free(sc->zk);

    sfree(sc);
}